

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomunk(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  expr *peVar2;
  expr **ppeVar3;
  int iVar4;
  
  if (ctx->reverse == 0) {
    peVar2 = (expr *)calloc(0x48,1);
    peVar2->type = EXPR_ID;
    peVar2->str = (char *)v;
    peVar2->special = 2;
    iVar4 = ctx->atomsnum;
    iVar1 = ctx->atomsmax;
    if (iVar4 < iVar1) {
      ppeVar3 = ctx->atoms;
    }
    else {
      iVar4 = 0x10;
      if (iVar1 != 0) {
        iVar4 = iVar1 * 2;
      }
      ctx->atomsmax = iVar4;
      ppeVar3 = (expr **)realloc(ctx->atoms,(long)iVar4 << 3);
      ctx->atoms = ppeVar3;
      iVar4 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar4 + 1;
    ppeVar3[iVar4] = peVar2;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomunk APROTO {
	if (ctx->reverse)
		return 0;
	struct expr *expr = makeex(EXPR_ID);
	expr->str = v;
	expr->special = 2;
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}